

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowUp2_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint16_t p3_1;
  uint16_t p2_1;
  uint16_t p1_1;
  uint16_t p0_1;
  uint16_t p3;
  uint16_t p2;
  uint16_t p1;
  uint16_t p0;
  int x;
  uint16_t *src2;
  int dst_width_local;
  uint16_t *dst_local;
  ptrdiff_t src_stride_local;
  uint16_t *src_ptr_local;
  
  src2 = src_ptr + src_stride;
  dst_local = dst;
  src_ptr_local = src_ptr;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    uVar1 = *src_ptr_local;
    uVar2 = src_ptr_local[1];
    uVar3 = *src2;
    uVar4 = src2[1];
    *dst_local = (uint16_t)
                 ((int)((uint)uVar1 * 9 + (uint)uVar2 * 3 + (uint)uVar3 * 3 + (uint)uVar4 + 8) >> 4)
    ;
    dst_local[1] = (uint16_t)
                   ((int)((uint)uVar1 * 3 + (uint)uVar2 * 9 + (uint)uVar3 + (uint)uVar4 * 3 + 8) >>
                   4);
    src_ptr_local = src_ptr_local + 1;
    src2 = src2 + 1;
    dst_local = dst_local + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst_local = (uint16_t)
                 ((int)((uint)*src_ptr_local * 9 + (uint)src_ptr_local[1] * 3 + (uint)*src2 * 3 +
                        (uint)src2[1] + 8) >> 4);
  }
  return;
}

Assistant:

void ScaleRowUp2_16_C(const uint16_t* src_ptr,
                      ptrdiff_t src_stride,
                      uint16_t* dst,
                      int dst_width) {
  const uint16_t* src2 = src_ptr + src_stride;

  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    uint16_t p0 = src_ptr[0];
    uint16_t p1 = src_ptr[1];
    uint16_t p2 = src2[0];
    uint16_t p3 = src2[1];
    dst[0] = (p0 * 9 + p1 * 3 + p2 * 3 + p3 + 8) >> 4;
    dst[1] = (p0 * 3 + p1 * 9 + p2 + p3 * 3 + 8) >> 4;
    ++src_ptr;
    ++src2;
    dst += 2;
  }
  if (dst_width & 1) {
    uint16_t p0 = src_ptr[0];
    uint16_t p1 = src_ptr[1];
    uint16_t p2 = src2[0];
    uint16_t p3 = src2[1];
    dst[0] = (p0 * 9 + p1 * 3 + p2 * 3 + p3 + 8) >> 4;
  }
}